

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_state.c
# Opt level: O0

void resizestack(lua_State *L,MSize n)

{
  uint uVar1;
  MSize nsz;
  lua_State *L_00;
  void *pvVar2;
  long lVar3;
  MSize osz;
  int in_ESI;
  ulong in_RDI;
  GCobj *up;
  MSize realsize;
  MSize oldsize;
  ptrdiff_t delta;
  TValue *oldst;
  TValue *st;
  uint *local_38;
  void *in_stack_ffffffffffffffd8;
  
  L_00 = (lua_State *)(ulong)*(uint *)(in_RDI + 0x24);
  osz = *(MSize *)(in_RDI + 0x38);
  nsz = in_ESI + 6;
  pvVar2 = lj_mem_realloc(L_00,in_stack_ffffffffffffffd8,osz,nsz);
  *(int *)(in_RDI + 0x24) = (int)pvVar2;
  lVar3 = (long)pvVar2 - (long)L_00;
  *(int *)(in_RDI + 0x20) = (int)pvVar2 + in_ESI * 8;
  for (; osz < nsz; osz = osz + 1) {
    *(undefined4 *)((long)pvVar2 + (ulong)osz * 8 + 4) = 0xffffffff;
  }
  *(MSize *)(in_RDI + 0x38) = nsz;
  *(long *)(in_RDI + 0x10) = *(long *)(in_RDI + 0x10) + lVar3;
  *(long *)(in_RDI + 0x18) = *(long *)(in_RDI + 0x18) + lVar3;
  uVar1 = *(uint *)(in_RDI + 0x28);
  while (local_38 = (uint *)(ulong)uVar1, local_38 != (uint *)0x0) {
    local_38[4] = local_38[4] + (int)lVar3;
    uVar1 = *local_38;
  }
  if (in_RDI == *(uint *)((ulong)*(uint *)(in_RDI + 8) + 0xf4)) {
    *(int *)((ulong)*(uint *)(in_RDI + 8) + 0xf8) =
         *(int *)((ulong)*(uint *)(in_RDI + 8) + 0xf8) + (int)lVar3;
  }
  return;
}

Assistant:

static void resizestack(lua_State *L, MSize n)
{
  TValue *st, *oldst = tvref(L->stack);
  ptrdiff_t delta;
  MSize oldsize = L->stacksize;
  MSize realsize = n + 1 + LJ_STACK_EXTRA;
  GCobj *up;
  lua_assert((MSize)(tvref(L->maxstack)-oldst)==L->stacksize-LJ_STACK_EXTRA-1);
  st = (TValue *)lj_mem_realloc(L, tvref(L->stack),
				(MSize)(L->stacksize*sizeof(TValue)),
				(MSize)(realsize*sizeof(TValue)));
  setmref(L->stack, st);
  delta = (char *)st - (char *)oldst;
  setmref(L->maxstack, st + n);
  while (oldsize < realsize)  /* Clear new slots. */
    setnilV(st + oldsize++);
  L->stacksize = realsize;
  L->base = (TValue *)((char *)L->base + delta);
  L->top = (TValue *)((char *)L->top + delta);
  for (up = gcref(L->openupval); up != NULL; up = gcnext(up))
    setmref(gco2uv(up)->v, (TValue *)((char *)uvval(gco2uv(up)) + delta));
  if (obj2gco(L) == gcref(G(L)->jit_L))
    setmref(G(L)->jit_base, mref(G(L)->jit_base, char) + delta);
}